

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

char * lj_strfmt_wptr(char *p,void *v)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (v != (void *)0x0) {
    if ((ulong)v >> 0x20 == 0) {
      uVar3 = 10;
    }
    else {
      uVar1 = 0x1f;
      uVar2 = (uint)((ulong)v >> 0x20);
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar3 = (ulong)((uVar1 >> 2 & 6) + 0xc);
    }
    p[0] = '0';
    p[1] = 'x';
    uVar4 = uVar3;
    while (uVar4 = uVar4 - 1, 1 < uVar4) {
      p[uVar4] = "0123456789abcdef"[(uint)v & 0xf];
      v = (void *)((long)v >> 4);
    }
    return p + uVar3;
  }
  builtin_strncpy(p,"NULL",4);
  return p + 4;
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wptr(char *p, const void *v)
{
  ptrdiff_t x = (ptrdiff_t)v;
  MSize i, n = STRFMT_MAXBUF_PTR;
  if (x == 0) {
    *p++ = 'N'; *p++ = 'U'; *p++ = 'L'; *p++ = 'L';
    return p;
  }
#if LJ_64
  /* Shorten output for 64 bit pointers. */
  n = 2+2*4+((x >> 32) ? 2+2*(lj_fls((uint32_t)(x >> 32))>>3) : 0);
#endif
  p[0] = '0';
  p[1] = 'x';
  for (i = n-1; i >= 2; i--, x >>= 4)
    p[i] = "0123456789abcdef"[(x & 15)];
  return p+n;
}